

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::AppendSuccessInformation(cmFindPackageCommand *this)

{
  bool bVar1;
  bool bVar2;
  cmState *pcVar3;
  char *value;
  string found;
  string requiredInfoPropName;
  string versionInfo;
  string versionInfoPropName;
  string quietInfoPropName;
  string upperFound;
  string local_140;
  string local_120;
  char *local_100;
  undefined8 local_f8;
  char local_f0 [16];
  cmAlphaNum local_e0;
  string local_b0;
  string local_90;
  string local_70;
  cmAlphaNum local_50;
  
  local_50.View_._M_len = 7;
  local_50.View_._M_str = "_CMAKE_";
  local_e0.View_._M_str = (this->Name)._M_dataplus._M_p;
  local_e0.View_._M_len = (this->Name)._M_string_length;
  cmStrCat<char[23]>(&local_140,&local_50,&local_e0,(char (*) [23])"_TRANSITIVE_DEPENDENCY");
  pcVar3 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
  cmState::SetGlobalProperty(pcVar3,&local_140,"False");
  std::__cxx11::string::~string((string *)&local_140);
  local_50.View_._M_str = (this->Name)._M_dataplus._M_p;
  local_50.View_._M_len = (this->Name)._M_string_length;
  local_e0.View_._M_len = 6;
  local_e0.View_._M_str = "_FOUND";
  cmStrCat<>(&local_140,&local_50,&local_e0);
  cmsys::SystemTools::UpperCase(&local_70,&local_140);
  bVar1 = cmMakefile::IsOn((this->super_cmFindCommon).Makefile,&local_70);
  bVar2 = cmMakefile::IsOn((this->super_cmFindCommon).Makefile,&local_140);
  AppendToFoundProperty(this,bVar1 || bVar2);
  local_50.View_._M_len = 7;
  local_50.View_._M_str = "_CMAKE_";
  local_e0.View_._M_str = (this->Name)._M_dataplus._M_p;
  local_e0.View_._M_len = (this->Name)._M_string_length;
  cmStrCat<char[7]>(&local_90,&local_50,&local_e0,(char (*) [7])0x646060);
  pcVar3 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
  value = "FALSE";
  if (this->Quiet != false) {
    value = "TRUE";
  }
  cmState::SetGlobalProperty(pcVar3,&local_90,value);
  local_50.View_._M_len = 7;
  local_50.View_._M_str = "_CMAKE_";
  local_e0.View_._M_str = (this->Name)._M_dataplus._M_p;
  local_e0.View_._M_len = (this->Name)._M_string_length;
  cmStrCat<char[18]>(&local_b0,&local_50,&local_e0,(char (*) [18])0x6407a5);
  local_100 = local_f0;
  local_f8 = 0;
  local_f0[0] = '\0';
  if ((this->VersionRange)._M_string_length == 0) {
    if ((this->Version)._M_string_length != 0) {
      local_50.View_._M_str = ">=";
      if (this->VersionExact != false) {
        local_50.View_._M_str = "==";
      }
      local_50.View_._M_len = 2;
      local_e0.View_._M_str = local_e0.Digits_;
      local_e0.View_._M_len = 1;
      local_e0.Digits_[0] = ' ';
      cmStrCat<std::__cxx11::string>(&local_120,&local_50,&local_e0,&this->Version);
      std::__cxx11::string::operator=((string *)&local_100,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_100);
  }
  pcVar3 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
  cmState::SetGlobalProperty(pcVar3,&local_b0,local_100);
  if (this->Required == true) {
    local_50.View_._M_len = 7;
    local_50.View_._M_str = "_CMAKE_";
    local_e0.View_._M_str = (this->Name)._M_dataplus._M_p;
    local_e0.View_._M_len = (this->Name)._M_string_length;
    cmStrCat<char[6]>(&local_120,&local_50,&local_e0,(char (*) [6])0x697f21);
    pcVar3 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
    cmState::SetGlobalProperty(pcVar3,&local_120,"REQUIRED");
    std::__cxx11::string::~string((string *)&local_120);
  }
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_140);
  return;
}

Assistant:

void cmFindPackageCommand::AppendSuccessInformation()
{
  {
    std::string const transitivePropName =
      cmStrCat("_CMAKE_", this->Name, "_TRANSITIVE_DEPENDENCY");
    this->Makefile->GetState()->SetGlobalProperty(transitivePropName, "False");
  }
  std::string const found = cmStrCat(this->Name, "_FOUND");
  std::string const upperFound = cmSystemTools::UpperCase(found);

  bool const upperResult = this->Makefile->IsOn(upperFound);
  bool const result = this->Makefile->IsOn(found);
  bool const packageFound = (result || upperResult);

  this->AppendToFoundProperty(packageFound);

  // Record whether the find was quiet or not, so this can be used
  // e.g. in FeatureSummary.cmake
  std::string const quietInfoPropName =
    cmStrCat("_CMAKE_", this->Name, "_QUIET");
  this->Makefile->GetState()->SetGlobalProperty(
    quietInfoPropName, this->Quiet ? "TRUE" : "FALSE");

  // set a global property to record the required version of this package
  std::string const versionInfoPropName =
    cmStrCat("_CMAKE_", this->Name, "_REQUIRED_VERSION");
  std::string versionInfo;
  if (!this->VersionRange.empty()) {
    versionInfo = this->VersionRange;
  } else if (!this->Version.empty()) {
    versionInfo =
      cmStrCat(this->VersionExact ? "==" : ">=", ' ', this->Version);
  }
  this->Makefile->GetState()->SetGlobalProperty(versionInfoPropName,
                                                versionInfo.c_str());
  if (this->Required) {
    std::string const requiredInfoPropName =
      cmStrCat("_CMAKE_", this->Name, "_TYPE");
    this->Makefile->GetState()->SetGlobalProperty(requiredInfoPropName,
                                                  "REQUIRED");
  }
}